

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void algorithm_suite::copy_if_sequence(void)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> input;
  undefined8 local_60;
  double local_58;
  vector<double,_std::allocator<double>_> local_50;
  double local_38 [5];
  
  local_38[2] = 3.0;
  local_38[3] = 4.0;
  local_38[0] = 1.0;
  local_38[1] = 2.0;
  local_38[4] = 5.0;
  __l._M_len = 5;
  __l._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector(&local_50,__l,(allocator_type *)&local_60);
  local_58 = 0.0;
  local_38[0] = 0.0;
  for (pdVar1 = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar1 != local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    if (*pdVar1 < 3.0) {
      local_38[0] = (double)((long)local_38[0] + 1);
      auVar2._8_4_ = (int)((ulong)local_38[0] >> 0x20);
      auVar2._0_8_ = local_38[0];
      auVar2._12_4_ = 0x45300000;
      local_58 = local_58 +
                 (*pdVar1 - local_58) /
                 ((auVar2._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,SUB84(local_38[0],0)) - 4503599627370496.0));
    }
  }
  local_60 = CONCAT44(local_60._4_4_,2);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2dd,"void algorithm_suite::copy_if_sequence()",local_38,(allocator_type *)&local_60)
  ;
  local_38[0] = local_58;
  local_60 = 0x3ff8000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2de,"void algorithm_suite::copy_if_sequence()",local_38,(allocator_type *)&local_60)
  ;
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void copy_if_sequence()
{
    std::vector<double> input = { 1.0, 2.0, 3.0, 4.0, 5.0 };
    cumulative::moment<double> filter;
    std::copy_if(input.begin(), input.end(), push_inserter(filter), less_than<double>(3.0));
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.5);
}